

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

uint __thiscall
Inline::HandleDifferentTypesSameFunction
          (Inline *this,FixedFieldInfo *fixedFunctionInfoArray,uint16 cachedFixedInlineeCount)

{
  intptr_t iVar1;
  intptr_t iVar2;
  undefined1 local_88 [8];
  FixedFieldInfo tmpInfo;
  ushort local_20;
  ushort local_1e;
  ushort local_1c;
  uint16 j;
  uint16 i;
  uint16 swapIndex;
  uint16 uniqueCount;
  uint16 cachedFixedInlineeCount_local;
  FixedFieldInfo *fixedFunctionInfoArray_local;
  Inline *this_local;
  
  local_20 = 0;
  local_1c = cachedFixedInlineeCount;
  while (local_20 < cachedFixedInlineeCount) {
    local_1e = local_20 + 1;
    tmpInfo.m_data.environmentAddr.ptr._6_2_ = local_20;
    while (tmpInfo.m_data.environmentAddr.ptr._6_2_ = tmpInfo.m_data.environmentAddr.ptr._6_2_ + 1,
          tmpInfo.m_data.environmentAddr.ptr._6_2_ < cachedFixedInlineeCount) {
      iVar1 = FixedFieldInfo::GetFieldValue(fixedFunctionInfoArray + local_20);
      iVar2 = FixedFieldInfo::GetFieldValue
                        (fixedFunctionInfoArray + tmpInfo.m_data.environmentAddr.ptr._6_2_);
      if (iVar1 == iVar2) {
        FixedFieldInfo::FixedFieldInfo
                  ((FixedFieldInfo *)local_88,
                   fixedFunctionInfoArray + tmpInfo.m_data.environmentAddr.ptr._6_2_);
        FixedFieldInfo::operator=
                  (fixedFunctionInfoArray + tmpInfo.m_data.environmentAddr.ptr._6_2_,
                   fixedFunctionInfoArray + local_1e);
        FixedFieldInfo::operator=(fixedFunctionInfoArray + local_1e,(FixedFieldInfo *)local_88);
        FixedFieldInfo::SetNextHasSameFixedField(fixedFunctionInfoArray + (int)(local_1e - 1));
        local_1e = local_1e + 1;
        local_1c = local_1c - 1;
      }
    }
    local_20 = local_1e;
  }
  return (uint)local_1c;
}

Assistant:

uint
Inline::HandleDifferentTypesSameFunction(__inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFunctionInfoArray, uint16 cachedFixedInlineeCount)
{
    uint16 uniqueCount = cachedFixedInlineeCount;
    uint16 swapIndex;
    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
    {
        swapIndex = i+1;
        for (uint16 j = i+1; j < cachedFixedInlineeCount; j++)
        {
            if (fixedFunctionInfoArray[i].GetFieldValue() == fixedFunctionInfoArray[j].GetFieldValue())
            {
                FixedFieldInfo tmpInfo = fixedFunctionInfoArray[j];
                fixedFunctionInfoArray[j] = fixedFunctionInfoArray[swapIndex];
                fixedFunctionInfoArray[swapIndex] = tmpInfo;
                fixedFunctionInfoArray[swapIndex - 1].SetNextHasSameFixedField();
                swapIndex++;
                uniqueCount--;
            }
        }
        i = swapIndex-1;
    }
    return uniqueCount;
}